

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void __thiscall SVGChart::DummyData::DummyData(DummyData *this,long inSize)

{
  undefined8 in_RAX;
  long lVar1;
  undefined8 uStack_28;
  
  (this->super_PlotDataBase)._vptr_PlotDataBase = (_func_int **)&PTR__DummyData_00111738;
  (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0;
  if (inSize < 1) {
    inSize = lVar1;
  }
  uStack_28 = in_RAX;
  for (; inSize != lVar1; lVar1 = lVar1 + 1) {
    uStack_28 = CONCAT44((float)(int)lVar1,(undefined4)uStack_28);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&this->mRealPlotData,(float *)((long)&uStack_28 + 4));
  }
  return;
}

Assistant:

DummyData::DummyData (long inSize) {
      for (int theI=0;theI<inSize;theI++) {
        mRealPlotData.push_back (theI);// simple ascending data
      }
    }